

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O3

void OPL_STATUS_RESET(FM_OPL *OPL,int flag)

{
  byte bVar1;
  
  bVar1 = ~(byte)flag & OPL->status;
  OPL->status = bVar1;
  if (((char)bVar1 < '\0') && ((OPL->statusmask & bVar1) == 0)) {
    OPL->status = bVar1 & 0x7f;
    if (OPL->IRQHandler != (OPL_IRQHANDLER)0x0) {
      (*OPL->IRQHandler)(OPL->IRQParam,'\0');
      return;
    }
  }
  return;
}

Assistant:

INLINE void OPL_STATUS_RESET(FM_OPL *OPL,int flag)
{
	/* reset status flag */
	OPL->status &=~flag;
	if((OPL->status & 0x80))
	{
		if (!(OPL->status & OPL->statusmask) )
		{
			OPL->status &= 0x7f;
			/* callback user interrupt handler (IRQ is ON to OFF) */
			if(OPL->IRQHandler) (OPL->IRQHandler)(OPL->IRQParam,0);
		}
	}
}